

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitMatrix.cpp
# Opt level: O3

bool __thiscall ZXing::BitMatrix::getBottomRightOnBit(BitMatrix *this,int *right,int *bottom)

{
  pointer puVar1;
  pointer puVar2;
  ulong uVar3;
  int iVar4;
  long lVar5;
  pointer puVar6;
  pointer puVar7;
  pointer puVar8;
  pointer puVar9;
  
  puVar1 = (this->_bits).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (this->_bits).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  uVar3 = (long)puVar2 - (long)puVar1;
  lVar5 = (long)uVar3 >> 2;
  puVar6 = puVar2;
  puVar7 = puVar2;
  if (0 < lVar5) {
    puVar7 = puVar2 + -(uVar3 & 0xfffffffffffffffc);
    puVar6 = puVar2 + lVar5 * -4;
    puVar9 = puVar2 + -2;
    lVar5 = lVar5 + 1;
    puVar8 = puVar2;
    do {
      if (puVar8[-1] != '\0') goto LAB_001313e0;
      if (*puVar9 != '\0') {
        puVar8 = puVar8 + -1;
        goto LAB_001313e0;
      }
      if (puVar9[-1] != '\0') {
        puVar8 = puVar8 + -2;
        goto LAB_001313e0;
      }
      if (puVar9[-2] != '\0') {
        puVar8 = puVar8 + -3;
        goto LAB_001313e0;
      }
      puVar8 = puVar8 + -4;
      puVar9 = puVar9 + -4;
      lVar5 = lVar5 + -1;
    } while (1 < lVar5);
  }
  lVar5 = (long)puVar7 - (long)puVar1;
  if (lVar5 != 1) {
    if (lVar5 != 2) {
      puVar8 = puVar1;
      if ((lVar5 != 3) || (puVar8 = puVar7, puVar7[-1] != '\0')) goto LAB_001313e0;
      puVar6 = puVar6 + -1;
      puVar7 = puVar6;
    }
    puVar8 = puVar7;
    if (puVar7[-1] != '\0') goto LAB_001313e0;
    puVar7 = puVar6 + -1;
  }
  puVar8 = puVar1;
  if (puVar7[-1] != '\0') {
    puVar8 = puVar7;
  }
LAB_001313e0:
  iVar4 = ~((int)puVar2 - (int)puVar8) + (int)uVar3;
  if (-1 < iVar4) {
    *bottom = iVar4 / this->_width;
    *right = iVar4 % this->_width;
  }
  return -1 < iVar4;
}

Assistant:

bool
BitMatrix::getBottomRightOnBit(int& right, int& bottom) const
{
	int bitsOffset = Size(_bits) - 1 - (int)std::distance(_bits.rbegin(), std::find_if(_bits.rbegin(), _bits.rend(), isSet));
	if (bitsOffset < 0) {
		return false;
	}

	bottom = bitsOffset / _width;
	right = (bitsOffset % _width);
	return true;
}